

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O2

stumpless_param * stumpless_new_param_from_string(char *string)

{
  char cVar1;
  stumpless_param *__ptr;
  config_mutex_t *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  char *__s;
  
  if (string == (char *)0x0) {
    raise_argument_empty("string was NULL");
  }
  else {
    __ptr = (stumpless_param *)alloc_mem(0x48);
    if (__ptr != (stumpless_param *)0x0) {
      pcVar2 = thread_safety_new_mutex();
      __ptr->mutex = pcVar2;
      if (pcVar2 != (config_mutex_t *)0x0) {
        sVar3 = 0;
        for (__s = string + 2; cVar1 = __s[-2], cVar1 != '='; __s = __s + 1) {
          if (sVar3 == 0x20) {
            raise_argument_too_big("length of string exceeded maximum limit",0,(char *)0x0);
            goto LAB_0010e30f;
          }
          if ((((cVar1 < '!') || (cVar1 == '\"')) || (cVar1 == '\x7f')) || (cVar1 == ']'))
          goto LAB_0010e30a;
          __ptr->name[sVar3] = cVar1;
          sVar3 = sVar3 + 1;
        }
        __ptr->name_length = sVar3;
        if (((__s[-1] == '\"') && (sVar4 = strlen(__s), sVar4 != 0)) && (__s[sVar4 - 1] == '\"')) {
          __dest = (char *)alloc_mem(sVar4);
          __ptr->value = __dest;
          if (__dest != (char *)0x0) {
            sVar4 = sVar4 - 1;
            memcpy(__dest,__s,sVar4);
            __ptr->value[sVar4] = '\0';
            __ptr->value_length = sVar4;
            clear_error();
            return __ptr;
          }
        }
        else {
LAB_0010e30a:
          raise_invalid_param();
        }
      }
LAB_0010e30f:
      free_mem(__ptr);
    }
  }
  return (stumpless_param *)0x0;
}

Assistant:

struct stumpless_param *
stumpless_new_param_from_string( const char *string ) {
  struct stumpless_param *param;
  size_t i;
  const char *value;
  size_t value_len;

  VALIDATE_ARG_NOT_NULL( string );

  param = alloc_mem( sizeof( *param ) );
  if( !param ){
    return NULL;
  }

  // this setup should be consolidated once the load param function
  // is able to accept string references instead of only NULL-terminated strings
  config_assign_cached_mutex( param->mutex );
  if( !config_check_mutex_valid( param->mutex ) ) {
    goto fail;
  }
  config_init_journald_param( param );

  // validate and load the param name
  for( i = 0; string[i] != '='; i++ ){
    if( i >= STUMPLESS_MAX_PARAM_NAME_LENGTH ){
      raise_argument_too_big( L10N_STRING_TOO_LONG_ERROR_MESSAGE,
                              0,
                              NULL );
      goto fail;
    }

    if( string[i] < 33 ||
        string[i] > 126 ||
        string[i] == ']' ||
        string[i] == '"' ){
      raise_invalid_param();
      goto fail;
    }

    param->name[i] = string[i];
  }
  param->name_length = i;
  
  // validate the character after the '=' is '"'
  if( string[i + 1] != '"' ){
    raise_invalid_param();
    goto fail;
  }

  value = string + i + 2;
  value_len = strlen( value );

  // validate the final character is '"'
  if( value_len == 0 || value[value_len-1] != '"' ){
    raise_invalid_param();
    goto fail;
  }

  // we're going to replace the ending '"' with a null character
  param->value = alloc_mem( value_len );
  if( !param->value ){
    goto fail;
  }

  memcpy( param->value, value, value_len - 1 );
  param->value[value_len-1] = '\0';
  param->value_length = value_len - 1;

  clear_error();
  return param;

fail:
  free_mem( param );
  return NULL;
}